

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  bool bVar1;
  RelationsAnalyzer *this_00;
  
  this_00 = this;
  bVar1 = VRLocation::isJustLoopJoin(join);
  if ((!bVar1) && (bVar1 = VRLocation::isJustBranchJoin(join), !bVar1)) {
    (__return_storage_ptr__->
    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  bVar1 = VRLocation::isJustBranchJoin(join);
  if (bVar1) {
    getBranchChangeLocations(__return_storage_ptr__,this_00,join,froms);
  }
  else {
    getLoopChangeLocations(__return_storage_ptr__,this,join,froms);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getChangeLocations(const VRLocation &join,
                                      const VectorSet<V> &froms) {
    if (!join.isJustLoopJoin() && !join.isJustBranchJoin())
        return {};
    if (join.isJustBranchJoin()) {
        return getBranchChangeLocations(join, froms);
    }
    assert(join.isJustLoopJoin());
    return getLoopChangeLocations(join, froms);
}